

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O3

void sdf::RenderDepth(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps,
                     float max_ray_length,float min_ray_length,float precision,
                     vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                     Mat *Depth)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar21;
  undefined1 auVar20 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  Mat Z_img;
  ulong local_180;
  Vector3d local_158;
  undefined8 uStack_140;
  double local_138;
  double local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  ulong local_108;
  ulong local_100;
  double local_f8;
  double local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  Mat local_90 [16];
  long local_80;
  long *local_48;
  
  local_118._0_4_ = precision;
  local_128._0_4_ = max_ray_length;
  cv::Mat::Mat(local_90,rows,cols,5);
  dVar19 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[0] * 0.0;
  dVar21 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[1] * 0.0;
  dVar24 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[4];
  dVar1 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[5];
  dVar23 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[6];
  dVar12 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[8];
  dVar4 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[9];
  dVar5 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[10];
  dVar6 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[0xc];
  dVar7 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[0xd];
  dVar8 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
          m_storage.m_data.array[0xe];
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.000000000001;
  uStack_140 = 0x3ff0000000000000;
  local_c8 = dVar6 * 1.0 + dVar12 * 0.0 + dVar24 * 0.0 + dVar19;
  dStack_c0 = dVar7 * 1.0 + dVar4 * 0.0 + dVar1 * 0.0 + dVar21;
  dVar22 = (transformation->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
           m_storage.m_data.array[2] * 0.0;
  local_d8 = dVar5 * 0.0 + dVar22 + dVar23 * 0.0 + dVar8 * 1.0;
  auVar25._0_8_ = (dVar12 * 1.000000000001 + dVar24 * 0.0 + dVar19 + dVar6) - local_c8;
  auVar25._8_8_ = (dVar4 * 1.000000000001 + dVar1 * 0.0 + dVar21 + dVar7) - dStack_c0;
  dVar24 = (dVar5 * 1.000000000001 + dVar22 + dVar23 * 0.0 + dVar8 * 1.0) - local_d8;
  auVar13._0_8_ = dVar24 * dVar24 + auVar25._8_8_ * auVar25._8_8_ + auVar25._0_8_ * auVar25._0_8_;
  if (0.0 < auVar13._0_8_) {
    auVar13._8_8_ = 0;
    auVar13 = sqrtpd(auVar13,auVar13);
    auVar14._0_8_ = auVar13._0_8_;
    dVar24 = dVar24 / auVar14._0_8_;
    auVar14._8_8_ = auVar14._0_8_;
    auVar25 = divpd(auVar25,auVar14);
  }
  dStack_d0 = local_d8;
  if (0 < rows) {
    local_138 = (double)min_ray_length;
    bVar3 = min_ray_length < (float)local_128._0_4_;
    local_f8 = (double)(float)local_128._0_4_;
    local_130 = (double)(float)local_118._0_4_;
    local_108 = (ulong)(uint)rows;
    local_100 = (ulong)(uint)cols;
    local_180 = 0;
    local_b8 = dVar24;
    dStack_b0 = local_d8;
    local_a8 = auVar25;
    do {
      if (0 < cols) {
        uVar10 = 0;
        do {
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (double)((float)(int)uVar10 -
                             (cam_params->
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                             m_data.array[2]) /
                     (double)(cam_params->
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                             m_data.array[0];
          dVar24 = (double)((float)(int)local_180 -
                           (cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>)
                           .m_storage.m_data.array[3]) /
                   (double)(cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>)
                           .m_storage.m_data.array[1];
          auVar2._8_4_ = SUB84(dVar24,0);
          auVar2._0_8_ = local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
          auVar2._12_4_ = (int)((ulong)dVar24 >> 0x20);
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = auVar2._8_8_;
          local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = 1.0;
          uStack_140 = 0x3ff0000000000000;
          auVar20._0_8_ =
               (local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] *
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [4] + local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] *
                      (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0] +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [8] + (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0xc]) - local_c8;
          auVar20._8_8_ =
               (local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] *
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [5] + local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] *
                      (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[1] +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [9] + (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0xd]) - dStack_c0;
          dVar24 = (local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[1] *
                    (transformation->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array[6] +
                    local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[0] *
                    (transformation->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array[2] +
                    (transformation->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                    array[10] +
                   (transformation->m_matrix).
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array[0xe]) - local_d8;
          auVar15._0_8_ =
               dVar24 * dVar24 + auVar20._8_8_ * auVar20._8_8_ + auVar20._0_8_ * auVar20._0_8_;
          if (0.0 < auVar15._0_8_) {
            auVar15._8_8_ = 0;
            auVar13 = sqrtpd(auVar15,auVar15);
            auVar16._0_8_ = auVar13._0_8_;
            dVar24 = dVar24 / auVar16._0_8_;
            auVar16._8_8_ = auVar16._0_8_;
            auVar20 = divpd(auVar20,auVar16);
          }
          fVar11 = NAN;
          if (bVar3 && 0 < max_steps) {
            iVar9 = 1;
            dVar12 = 1.0;
            uVar17 = 0;
            uVar18 = 0;
            local_e8._8_4_ = 0;
            local_e8._0_8_ = dVar24;
            local_e8._12_4_ = 0x3ff00000;
            dVar23 = 0.0;
            dVar1 = local_138;
            local_128 = auVar20;
            do {
              local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = dVar1 * local_128._0_8_ + local_c8;
              local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = dVar1 * local_128._8_8_ + dStack_c0;
              local_118._8_4_ = uVar17;
              local_118._0_8_ = dVar1;
              local_118._12_4_ = uVar18;
              local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = dVar24 * dVar1 + local_d8;
              local_f0 = dVar12;
              dVar12 = SDF(&local_158,primitives);
              if (dVar12 < local_130) {
                if (local_138 <= dVar23) {
                  fVar11 = ABS((float)(((double)local_e8._0_8_ * local_b8 +
                                       (double)local_128._8_8_ * local_a8._8_8_ +
                                       (double)local_128._0_8_ * local_a8._0_8_) *
                                      (((((double)local_118._0_8_ + local_130) - dVar23) * local_f0)
                                       / (local_f0 - (dVar12 - local_130)) + dVar23)));
                }
                else {
                  *(undefined4 *)(*local_48 * local_180 + local_80 + uVar10 * 4) = 0x7fc00000;
                  fVar11 = NAN;
                }
                goto LAB_00105346;
              }
              if (max_steps <= iVar9) break;
              uVar17 = (undefined4)extraout_XMM0_Qb;
              uVar18 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
              dVar1 = dVar12 + (double)local_118._0_8_;
              iVar9 = iVar9 + 1;
              dVar23 = (double)local_118._0_8_;
              dVar24 = (double)local_e8._0_8_;
            } while (dVar1 < local_f8);
            fVar11 = NAN;
          }
LAB_00105346:
          *(float *)(*local_48 * local_180 + local_80 + uVar10 * 4) = fVar11;
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_100);
      }
      local_180 = local_180 + 1;
    } while (local_180 != local_108);
  }
  cv::Mat::operator=(Depth,local_90);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void RenderDepth(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length,
    const float min_ray_length,
    const float precision, 
    std::vector<Primitive*> &primitives, 
    cv::Mat &Depth)
  {

  // add noise to depth
  // std::mt19937_64 generator;
  // std::normal_distribution<float> distribution(0,RENDER_NOISE_STD);

  cv::Mat Z_img( rows, cols, CV_32FC1);

   Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
   Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized();

  //Rendering loop
  #pragma omp parallel for collapse(2)
  for(int u = 0; u < rows; ++u)
  {
    for(int v = 0; v < cols; ++v)
    {
      bool hit = false;
      Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;


      p.normalize();
            
      double scaling = min_ray_length;
      double scaling_prev=0;
      double D = 1.0;
      int steps=0;
      while(steps<max_steps && scaling < max_ray_length && !hit)
      { 

        double D_prev = D;
        D = sdf::SDF(camera + p*scaling, primitives);
        if(D < precision)
        {
          if(scaling_prev < min_ray_length)
          {
              Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
              break;
          }
          scaling = scaling_prev + ((scaling+precision) - scaling_prev)*D_prev/(D_prev - (D - precision));

          hit = true;
          float d = scaling*(viewAxis.dot(p));
          
          //conversion from range to depth
          // + scaling*scaling*distribution(generator)); //add noise dependent on the square of the distance
          Z_img.at<float>(u,v)=fabs(d);

          break;
        }
        scaling_prev = scaling;
        scaling += D;  
        ++steps;        
      }//ray
      if(!hit)     
      {
        Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
      }//no hit
    }//NUM_COLS
  }//NUM_ROWS
  Depth = Z_img;
  return;
  }